

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall MipsParser::matchSymbol(MipsParser *this,Parser *parser,char symbol)

{
  char symbol_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  if (symbol == '(') {
    this_local._7_1_ = Parser::matchToken(parser,LParen,false);
  }
  else if (symbol == ')') {
    this_local._7_1_ = Parser::matchToken(parser,RParen,false);
  }
  else if (symbol == ',') {
    this_local._7_1_ = Parser::matchToken(parser,Comma,false);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MipsParser::matchSymbol(Parser& parser, char symbol)
{
	switch (symbol)
	{
	case '(':
		return parser.matchToken(TokenType::LParen);
	case ')':
		return parser.matchToken(TokenType::RParen);
	case ',':
		return parser.matchToken(TokenType::Comma);
	}

	return false;
}